

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

ArgList * __thiscall
CompilerContext::get_args
          (ArgList *__return_storage_ptr__,CompilerContext *this,Command *command,
          SyntaxTree *command_node)

{
  broken_contract *this_00;
  long lVar1;
  pointer psVar2;
  ArgVariant local_60;
  
  lVar1 = (long)(command_node->childs).
                super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(command_node->childs).
                super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar1 != 0) {
    (__return_storage_ptr__->
    super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::reserve(__return_storage_ptr__,(lVar1 >> 4) - 1);
    psVar2 = (command_node->childs).
             super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    if (psVar2 != (command_node->childs).
                  super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        get_arg(&local_60,this,
                (psVar2->super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::
        emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)__return_storage_ptr__,&local_60);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
        ::_destroy(&local_60._storage);
        psVar2 = psVar2 + 1;
      } while (psVar2 != (command_node->childs).
                         super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    return __return_storage_ptr__;
  }
  this_00 = (broken_contract *)__cxa_allocate_exception(0x10);
  broken_contract::broken_contract
            (this_00,
             "Precondition failure at  /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp(650): command_node.child_count() >= 1."
            );
  __cxa_throw(this_00,&broken_contract::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto CompilerContext::get_args(const Command& command, const SyntaxTree& command_node) -> ArgList
{
    Expects(command_node.child_count() >= 1); // command_name + [args...]

    ArgList args;
    args.reserve(command_node.child_count() - 1);

    for(auto it = std::next(command_node.begin()); it != command_node.end(); ++it)
        args.emplace_back( get_arg(**it) );

    return args;
}